

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.cc
# Opt level: O3

int __thiscall
webrtc::Resampler::ResetIfNeeded(Resampler *this,int inFreq,int outFreq,size_t num_channels)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  Resampler *pRVar5;
  WebRtcSpl_State16khzTo48khz *pWVar6;
  WebRtcSpl_State8khzTo22khz *state;
  void *pvVar7;
  WebRtcSpl_State16khzTo22khz *state_00;
  WebRtcSpl_State48khzTo16khz *pWVar8;
  WebRtcSpl_State22khzTo8khz *pWVar9;
  WebRtcSpl_State22khzTo16khz *pWVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint outFreq_00;
  uint uVar14;
  
  if (((inFreq / 1000 == this->my_in_frequency_khz_) &&
      (outFreq / 1000 == this->my_out_frequency_khz_)) && (this->num_channels_ == num_channels)) {
    return 0;
  }
  iVar13 = -1;
  if (num_channels - 3 < 0xfffffffffffffffe) {
    return -1;
  }
  this->num_channels_ = num_channels;
  if (this->state1_ != (void *)0x0) {
    free(this->state1_);
    this->state1_ = (void *)0x0;
  }
  if (this->state2_ != (void *)0x0) {
    free(this->state2_);
    this->state2_ = (void *)0x0;
  }
  if (this->state3_ != (void *)0x0) {
    free(this->state3_);
    this->state3_ = (void *)0x0;
  }
  if (this->in_buffer_ != (int16_t *)0x0) {
    free(this->in_buffer_);
    this->in_buffer_ = (int16_t *)0x0;
  }
  if (this->out_buffer_ != (int16_t *)0x0) {
    free(this->out_buffer_);
    this->out_buffer_ = (int16_t *)0x0;
  }
  pRVar5 = this->slave_left_;
  if (pRVar5 != (Resampler *)0x0) {
    ~Resampler(pRVar5);
    operator_delete(pRVar5);
    this->slave_left_ = (Resampler *)0x0;
  }
  pRVar5 = this->slave_right_;
  if (pRVar5 != (Resampler *)0x0) {
    ~Resampler(pRVar5);
    operator_delete(pRVar5);
    this->slave_right_ = (Resampler *)0x0;
  }
  this->in_buffer_size_max_ = 0;
  this->out_buffer_size_max_ = 0;
  this->in_buffer_size_ = 0;
  this->out_buffer_size_ = 0;
  iVar12 = (int)((long)inFreq % (long)outFreq);
  uVar1 = (long)inFreq % (long)outFreq;
  iVar11 = outFreq;
  uVar3 = (ulong)(uint)outFreq;
  while (uVar2 = uVar1, iVar12 != 0) {
    iVar11 = (int)uVar2;
    uVar1 = (long)(int)uVar3 % (long)iVar11;
    iVar12 = (int)uVar1;
    uVar3 = uVar2;
  }
  this->my_in_frequency_khz_ = inFreq / 1000;
  this->my_out_frequency_khz_ = outFreq / 1000;
  uVar14 = inFreq / iVar11;
  outFreq_00 = outFreq / iVar11;
  if (this->num_channels_ == 2) {
    pRVar5 = (Resampler *)operator_new(0x70);
    Resampler(pRVar5,uVar14,outFreq_00,1);
    this->slave_left_ = pRVar5;
    pRVar5 = (Resampler *)operator_new(0x70);
    Resampler(pRVar5,uVar14,outFreq_00,1);
    this->slave_right_ = pRVar5;
  }
  if (uVar14 == outFreq_00) {
    this->my_mode_ = kResamplerMode1To1;
  }
  else if (uVar14 == 1) {
    switch(outFreq_00) {
    case 2:
      this->my_mode_ = kResamplerMode1To2;
LAB_00144de9:
      pvVar7 = calloc(1,0x20);
      this->state1_ = pvVar7;
      goto LAB_00144f91;
    case 3:
      this->my_mode_ = kResamplerMode1To3;
      pWVar6 = (WebRtcSpl_State16khzTo48khz *)malloc(0x60);
      this->state1_ = pWVar6;
      break;
    case 4:
      this->my_mode_ = kResamplerMode1To4;
LAB_00144f30:
      pvVar7 = calloc(1,0x20);
      this->state1_ = pvVar7;
      goto LAB_00144f7e;
    default:
      goto switchD_00144db3_caseD_5;
    case 6:
      this->my_mode_ = kResamplerMode1To6;
      pvVar7 = calloc(1,0x20);
      this->state1_ = pvVar7;
      pWVar6 = (WebRtcSpl_State16khzTo48khz *)malloc(0x60);
      this->state2_ = pWVar6;
      break;
    case 0xc:
      this->my_mode_ = kResamplerMode1To12;
      pvVar7 = calloc(1,0x20);
      this->state1_ = pvVar7;
      pvVar7 = calloc(1,0x20);
      this->state2_ = pvVar7;
      pWVar6 = (WebRtcSpl_State16khzTo48khz *)malloc(0x60);
      this->state3_ = pWVar6;
    }
    WebRtcSpl_ResetResample16khzTo48khz(pWVar6);
  }
  else if (outFreq_00 == 1) {
    switch(uVar14) {
    case 2:
      this->my_mode_ = kResamplerMode2To1;
      goto LAB_00144de9;
    case 3:
      this->my_mode_ = kResamplerMode3To1;
      pWVar8 = (WebRtcSpl_State48khzTo16khz *)malloc(0x80);
      this->state1_ = pWVar8;
LAB_00144f58:
      WebRtcSpl_ResetResample48khzTo16khz(pWVar8);
      break;
    case 4:
      this->my_mode_ = kResamplerMode4To1;
      goto LAB_00144f30;
    default:
      goto switchD_00144db3_caseD_5;
    case 6:
      this->my_mode_ = kResamplerMode6To1;
      pWVar8 = (WebRtcSpl_State48khzTo16khz *)malloc(0x80);
      this->state1_ = pWVar8;
      WebRtcSpl_ResetResample48khzTo16khz(pWVar8);
LAB_00144f7e:
      pvVar7 = calloc(1,0x20);
      this->state2_ = pvVar7;
      break;
    case 0xc:
      this->my_mode_ = kResamplerMode12To1;
      pWVar8 = (WebRtcSpl_State48khzTo16khz *)malloc(0x80);
      this->state1_ = pWVar8;
      WebRtcSpl_ResetResample48khzTo16khz(pWVar8);
      pvVar7 = calloc(1,0x20);
      this->state2_ = pvVar7;
LAB_00144fcd:
      pvVar7 = calloc(1,0x20);
      this->state3_ = pvVar7;
    }
  }
  else {
    if (outFreq_00 == 3 && (uVar14 ^ 2) == 0) {
      this->my_mode_ = kResamplerMode2To3;
      pWVar6 = (WebRtcSpl_State16khzTo48khz *)malloc(0x60);
      this->state1_ = pWVar6;
      WebRtcSpl_ResetResample16khzTo48khz(pWVar6);
      goto LAB_00144f7e;
    }
    uVar4 = outFreq_00 ^ 0xb;
    if ((uVar14 ^ 2) == 0 && uVar4 == 0) {
      this->my_mode_ = kResamplerMode2To11;
      pvVar7 = calloc(1,0x20);
      this->state1_ = pvVar7;
      state = (WebRtcSpl_State8khzTo22khz *)malloc(0x60);
      this->state2_ = state;
    }
    else {
      if (uVar14 != 4 || uVar4 != 0) {
        if (uVar14 == 8 && uVar4 == 0) {
          this->my_mode_ = kResamplerMode8To11;
          state_00 = (WebRtcSpl_State16khzTo22khz *)malloc(0x40);
          this->state1_ = state_00;
          WebRtcSpl_ResetResample16khzTo22khz(state_00);
        }
        else {
          if (uVar14 == 3 && (outFreq_00 ^ 2) == 0) {
            this->my_mode_ = kResamplerMode3To2;
            pvVar7 = calloc(1,0x20);
            this->state1_ = pvVar7;
            pWVar8 = (WebRtcSpl_State48khzTo16khz *)malloc(0x80);
            this->state2_ = pWVar8;
            goto LAB_00144f58;
          }
          uVar14 = uVar14 ^ 0xb;
          if ((outFreq_00 ^ 2) == 0 && uVar14 == 0) {
            this->my_mode_ = kResamplerMode11To2;
            pWVar9 = (WebRtcSpl_State22khzTo8khz *)malloc(0x80);
            this->state1_ = pWVar9;
            WebRtcSpl_ResetResample22khzTo8khz(pWVar9);
            goto LAB_00144f7e;
          }
          if (outFreq_00 == 4 && uVar14 == 0) {
            this->my_mode_ = kResamplerMode11To4;
            pWVar9 = (WebRtcSpl_State22khzTo8khz *)malloc(0x80);
            this->state1_ = pWVar9;
            WebRtcSpl_ResetResample22khzTo8khz(pWVar9);
          }
          else {
            if (outFreq_00 == 0x10 && uVar14 == 0) {
              this->my_mode_ = kResamplerMode11To16;
              pvVar7 = calloc(1,0x20);
              this->state1_ = pvVar7;
              pWVar10 = (WebRtcSpl_State22khzTo16khz *)malloc(0x60);
              this->state2_ = pWVar10;
            }
            else {
              if (outFreq_00 == 0x20 && uVar14 == 0) {
                this->my_mode_ = kResamplerMode11To32;
                pvVar7 = calloc(1,0x20);
                this->state1_ = pvVar7;
                pWVar10 = (WebRtcSpl_State22khzTo16khz *)malloc(0x60);
                this->state2_ = pWVar10;
                WebRtcSpl_ResetResample22khzTo16khz(pWVar10);
                goto LAB_00144fcd;
              }
              if (uVar14 != 0 || outFreq_00 != 8) {
                return -1;
              }
              this->my_mode_ = kResamplerMode11To8;
              pWVar10 = (WebRtcSpl_State22khzTo16khz *)malloc(0x60);
              this->state1_ = pWVar10;
            }
            WebRtcSpl_ResetResample22khzTo16khz(pWVar10);
          }
        }
        goto LAB_00144f91;
      }
      this->my_mode_ = kResamplerMode4To11;
      state = (WebRtcSpl_State8khzTo22khz *)malloc(0x60);
      this->state1_ = state;
    }
    WebRtcSpl_ResetResample8khzTo22khz(state);
  }
LAB_00144f91:
  iVar13 = 0;
switchD_00144db3_caseD_5:
  return iVar13;
}

Assistant:

int Resampler::ResetIfNeeded(int inFreq, int outFreq, size_t num_channels)
{
    int tmpInFreq_kHz = inFreq / 1000;
    int tmpOutFreq_kHz = outFreq / 1000;

    if ((tmpInFreq_kHz != my_in_frequency_khz_) || (tmpOutFreq_kHz != my_out_frequency_khz_)
            || (num_channels != num_channels_))
    {
        return Reset(inFreq, outFreq, num_channels);
    } else
    {
        return 0;
    }
}